

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

void __thiscall
Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
          (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,
          MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *factors)

{
  IntegerConstantType IStack_58;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  local_48;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_38;
  
  IntegerConstantType::IntegerConstantType(&IStack_58,1);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
            (&local_38,&factors->_factors);
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)&local_48,
             (MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)&local_38);
  Monom(this,&IStack_58,&local_48);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::~Stack
            (&local_38);
  IntegerConstantType::~IntegerConstantType(&IStack_58);
  return;
}

Assistant:

Monom(MonomFactors<Number> factors) : Monom(Numeral(1), perfect(std::move(factors))) {}